

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_image_resize_nn_to_buffer
          (rf_image *__return_storage_ptr__,rf_image image,int new_width,int new_height,void *dst,
          rf_int dst_size)

{
  rf_source_location source_location;
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  undefined8 in_R9;
  ulong uVar7;
  void *dst_00;
  void *pvVar8;
  long lVar9;
  long in_FS_OFFSET;
  bool bVar10;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  if (image.valid == true) {
    uVar1 = rf_bytes_per_pixel(image.format);
    uVar2 = new_height * new_width * uVar1;
    if (dst_size < (int)uVar2) {
      source_location.proc_name._0_4_ = 0x172f84;
      source_location.file_name =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      source_location.proc_name._4_4_ = 0;
      source_location.line_in_file = 0x3e62;
      rf_log_impl(source_location,RF_LOG_TYPE_ERROR,
                  "Expected `dst` to be at least %d bytes but was %d bytes",4,(ulong)uVar2,dst_size,
                  in_R9);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_image_resize_nn_to_buffer";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3e62;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 4;
    }
    else {
      lVar5 = (long)new_width;
      uVar7 = 0;
      lVar3 = 0;
      if (0 < lVar5) {
        lVar3 = lVar5;
      }
      uVar4 = 0;
      if (0 < new_height) {
        uVar4 = (ulong)(uint)new_height;
      }
      pvVar8 = dst;
      for (; uVar7 != uVar4; uVar7 = uVar7 + 1) {
        lVar6 = 0;
        dst_00 = pvVar8;
        lVar9 = lVar3;
        while (bVar10 = lVar9 != 0, lVar9 = lVar9 + -1, bVar10) {
          rf_format_one_pixel((void *)((long)(int)(((int)((ulong)lVar6 >> 0x10) +
                                                   (int)(uVar7 * (long)((image.height << 0x10) /
                                                                        new_height + 1) >> 0x10) *
                                                   image.width) * uVar1) + (long)image.data),
                              image.format,dst_00,image.format);
          lVar6 = lVar6 + ((image.width << 0x10) / new_width + 1);
          dst_00 = (void *)((long)dst_00 + (ulong)uVar1);
        }
        pvVar8 = (void *)((long)pvVar8 + lVar5 * (ulong)uVar1);
      }
      __return_storage_ptr__->data = dst;
      __return_storage_ptr__->width = new_width;
      __return_storage_ptr__->height = new_height;
      __return_storage_ptr__->format = image.format;
      __return_storage_ptr__->valid = true;
    }
  }
  else {
    rf_log_impl(8,0x172f3a,(char *)0x1);
    *(char **)(in_FS_OFFSET + -0x450) =
         "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
    ;
    *(char **)(in_FS_OFFSET + -0x448) = "rf_image_resize_nn_to_buffer";
    *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x3e64;
    *(undefined4 *)(in_FS_OFFSET + -0x438) = 1;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_image_resize_nn_to_buffer(rf_image image, int new_width, int new_height, void* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (image.valid)
    {
        int bpp = rf_bytes_per_pixel(image.format);
        int expected_size = new_width * new_height * bpp;

        if (dst_size >= expected_size)
        {
            // EDIT: added +1 to account for an early rounding problem
            int x_ratio = (int)((image.width  << 16) / new_width ) + 1;
            int y_ratio = (int)((image.height << 16) / new_height) + 1;

            unsigned char* src = image.data;

            int x2, y2;
            for (rf_int y = 0; y < new_height; y++)
            {
                for (rf_int x = 0; x < new_width; x++)
                {
                    x2 = ((x * x_ratio) >> 16);
                    y2 = ((y * y_ratio) >> 16);

                    rf_format_one_pixel(src + ((y2 * image.width) + x2) * bpp, image.format,
                                        ((unsigned char *) dst) + ((y * new_width) + x) * bpp, image.format);
                }
            }

            result.data   = dst;
            result.width  = new_width;
            result.height = new_height;
            result.format = image.format;
            result.valid  = true;
        }
        else RF_LOG_ERROR(RF_BAD_BUFFER_SIZE, "Expected `dst` to be at least %d bytes but was %d bytes", expected_size, dst_size);
    }
    else RF_LOG_ERROR(RF_BAD_ARGUMENT, "Image is invalid.");

    return result;
}